

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O2

FT_Error T1_Set_MM_WeightVector(T1_Face face,FT_UInt len,FT_Fixed *weightvector)

{
  uint uVar1;
  PS_Blend pPVar2;
  FT_Error FVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  
  pPVar2 = face->blend;
  FVar3 = 6;
  if (pPVar2 != (PS_Blend)0x0) {
    if (weightvector == (FT_Fixed *)0x0 && len == 0) {
      uVar1 = pPVar2->num_designs;
      FVar3 = 0;
      for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
        pPVar2->weight_vector[uVar5] = pPVar2->default_weight_vector[uVar5];
      }
    }
    else if (weightvector != (FT_Fixed *)0x0) {
      uVar1 = pPVar2->num_designs;
      uVar5 = (ulong)len;
      if (uVar1 < len) {
        uVar5 = (ulong)uVar1;
      }
      iVar4 = (int)uVar5;
      for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
        pPVar2->weight_vector[uVar6] = weightvector[uVar6];
      }
      for (; (uVar1 - iVar4) + (int)uVar6 != uVar5; uVar5 = uVar5 + 1) {
        pPVar2->weight_vector[uVar5] = 0;
      }
      (face->root).face_flags =
           (ulong)(len != 0) << 0xf | (face->root).face_flags & 0xffffffffffff7fffU;
      FVar3 = 0;
    }
  }
  return FVar3;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T1_Set_MM_WeightVector( T1_Face    face,
                          FT_UInt    len,
                          FT_Fixed*  weightvector )
  {
    PS_Blend  blend = face->blend;
    FT_UInt   i, n;


    if ( !blend )
     return FT_THROW( Invalid_Argument );

    if ( !len && !weightvector )
    {
      for ( i = 0; i < blend->num_designs; i++ )
        blend->weight_vector[i] = blend->default_weight_vector[i];
    }
    else
    {
      if ( !weightvector )
        return FT_THROW( Invalid_Argument );

      n = len < blend->num_designs ? len : blend->num_designs;

      for ( i = 0; i < n; i++ )
        blend->weight_vector[i] = weightvector[i];

      for ( ; i < blend->num_designs; i++ )
        blend->weight_vector[i] = (FT_Fixed)0;

      if ( len )
        face->root.face_flags |= FT_FACE_FLAG_VARIATION;
      else
        face->root.face_flags &= ~FT_FACE_FLAG_VARIATION;
    }

    return FT_Err_Ok;
  }